

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_app.cpp
# Opt level: O0

void unariesFromLabelling(int *inputLabelling,float *outputUnary,int W,int H,int dim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int local_40;
  int local_3c;
  int k_1;
  int k;
  int i;
  float p_energy;
  float n_energy;
  float u_energy;
  float GT_PROB;
  int dim_local;
  int H_local;
  int W_local;
  float *outputUnary_local;
  int *inputLabelling_local;
  
  dVar1 = log(1.0 / (double)dim);
  dVar2 = log(0.30000001192092896 / (double)(dim + -1));
  dVar3 = std::log(5.23867710795738e-315);
  for (k_1 = 0; k_1 < W * H; k_1 = k_1 + 1) {
    if (inputLabelling[k_1] < 0) {
      for (local_40 = 0; local_40 < dim; local_40 = local_40 + 1) {
        outputUnary[k_1 * dim + local_40] = (float)dVar1;
      }
    }
    else {
      for (local_3c = 0; local_3c < dim; local_3c = local_3c + 1) {
        outputUnary[k_1 * dim + local_3c] = (float)dVar2;
      }
      outputUnary[k_1 * dim + inputLabelling[k_1]] = SUB84(dVar3,0);
    }
  }
  return;
}

Assistant:

void unariesFromLabelling(const int *inputLabelling, float *outputUnary, int W, int H, int dim) {
    const float GT_PROB = 0.7;
    const float u_energy = log(1.0 / dim);
    const float n_energy = log((1.0 - GT_PROB) / (dim - 1));
    const float p_energy = log(GT_PROB);

    for (int i = 0; i < W*H; i++) {
        if (inputLabelling[i] >= 0) {
            for (int k = 0; k < dim; k++) {
                outputUnary[i*dim + k] = n_energy;
            }
            outputUnary[i*dim + inputLabelling[i]] = p_energy;
        }
        else {
            for (int k = 0; k < dim; k++) {
                outputUnary[i*dim + k] = u_energy;
            }
        }
    }
}